

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O3

chirc_user_t * chirc_ctx_get_user(chirc_ctx_t *ctx,char *nick)

{
  UT_hash_table *pUVar1;
  UT_hash_handle *pUVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  chirc_user_t *pcVar13;
  
  sVar4 = strlen(nick);
  if (ctx->users != (chirc_user_t *)0x0) {
    uVar12 = (uint)sVar4;
    pbVar5 = (byte *)nick;
    if (uVar12 < 0xc) {
      uVar7 = 0x9e3779b9;
      uVar6 = 0xfeedbeef;
      uVar8 = 0x9e3779b9;
      uVar10 = uVar12;
    }
    else {
      uVar6 = 0xfeedbeef;
      uVar8 = 0x9e3779b9;
      uVar9 = sVar4 & 0xffffffff;
      uVar7 = 0x9e3779b9;
      do {
        uVar6 = uVar6 + *(int *)(pbVar5 + 8);
        uVar10 = uVar6 >> 0xd ^ ((uVar7 + *(int *)pbVar5) - (uVar8 + *(int *)(pbVar5 + 4))) - uVar6;
        uVar8 = uVar10 << 8 ^ ((uVar8 + *(int *)(pbVar5 + 4)) - uVar6) - uVar10;
        uVar7 = uVar8 >> 0xd ^ (uVar6 - uVar10) - uVar8;
        uVar10 = uVar7 >> 0xc ^ (uVar10 - uVar8) - uVar7;
        uVar6 = uVar10 << 0x10 ^ (uVar8 - uVar7) - uVar10;
        uVar11 = uVar6 >> 5 ^ (uVar7 - uVar10) - uVar6;
        uVar7 = uVar11 >> 3 ^ (uVar10 - uVar6) - uVar11;
        uVar8 = uVar7 << 10 ^ (uVar6 - uVar11) - uVar7;
        uVar6 = uVar8 >> 0xf ^ (uVar11 - uVar7) - uVar8;
        pbVar5 = pbVar5 + 0xc;
        uVar10 = (int)uVar9 - 0xc;
        uVar9 = (ulong)uVar10;
      } while (0xb < uVar10);
    }
    uVar6 = uVar6 + uVar12;
    switch(uVar10) {
    case 0xb:
      uVar6 = (uint)pbVar5[10] * 0x1000000 + uVar6;
    case 10:
      uVar6 = (uint)pbVar5[9] * 0x10000 + uVar6;
    case 9:
      uVar6 = (uint)pbVar5[8] * 0x100 + uVar6;
    case 8:
      uVar8 = (uint)pbVar5[7] * 0x1000000 + uVar8;
    case 7:
      uVar8 = (uint)pbVar5[6] * 0x10000 + uVar8;
    case 6:
      uVar8 = (uint)pbVar5[5] * 0x100 + uVar8;
    case 5:
      uVar8 = pbVar5[4] + uVar8;
    case 4:
      uVar7 = (uint)pbVar5[3] * 0x1000000 + uVar7;
    case 3:
      uVar7 = (uint)pbVar5[2] * 0x10000 + uVar7;
    case 2:
      uVar7 = (uint)pbVar5[1] * 0x100 + uVar7;
    case 1:
      uVar7 = *pbVar5 + uVar7;
    }
    uVar10 = uVar6 >> 0xd ^ (uVar7 - uVar6) - uVar8;
    uVar8 = uVar10 << 8 ^ (uVar8 - uVar6) - uVar10;
    uVar6 = uVar8 >> 0xd ^ (uVar6 - uVar10) - uVar8;
    uVar7 = uVar6 >> 0xc ^ (uVar10 - uVar8) - uVar6;
    uVar10 = uVar7 << 0x10 ^ (uVar8 - uVar6) - uVar7;
    uVar6 = uVar10 >> 5 ^ (uVar6 - uVar7) - uVar10;
    uVar7 = uVar6 >> 3 ^ (uVar7 - uVar10) - uVar6;
    uVar10 = uVar7 << 10 ^ (uVar10 - uVar6) - uVar7;
    uVar10 = uVar10 >> 0xf ^ uVar6 - (uVar7 + uVar10);
    pUVar1 = (ctx->users->hh).tbl;
    pUVar2 = pUVar1->buckets[pUVar1->num_buckets - 1 & uVar10].hh_head;
    if (pUVar2 != (UT_hash_handle *)0x0) {
      pcVar13 = (chirc_user_t *)((long)pUVar2 - pUVar1->hho);
      while( true ) {
        if ((((pcVar13->hh).hashv == uVar10) && ((pcVar13->hh).keylen == uVar12)) &&
           (iVar3 = bcmp((pcVar13->hh).key,nick,sVar4 & 0xffffffff), iVar3 == 0)) {
          return pcVar13;
        }
        pUVar2 = (pcVar13->hh).hh_next;
        if (pUVar2 == (UT_hash_handle *)0x0) break;
        pcVar13 = (chirc_user_t *)((long)pUVar2 - pUVar1->hho);
      }
    }
  }
  return (chirc_user_t *)0x0;
}

Assistant:

chirc_user_t* chirc_ctx_get_user(chirc_ctx_t *ctx, char *nick)
{
    chirc_user_t *user;

    HASH_FIND_STR(ctx->users, nick, user);

    return user;
}